

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessBbrDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  string *this_00;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  Value *pVVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  BbrDataset *extraout_RDX;
  BbrDataset *extraout_RDX_00;
  BbrDataset *extraout_RDX_01;
  BbrDataset *extraout_RDX_02;
  BbrDataset *aDataset;
  char *pcVar9;
  _Alloc_hider _Var10;
  undefined1 *puVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  undefined1 *puVar12;
  bool bVar13;
  bool bVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string triHostname;
  BbrDataset dataset;
  string local_3f8;
  undefined1 local_3d8 [8];
  _Alloc_hider _Stack_3d0;
  undefined1 local_3c8 [24];
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  undefined1 local_390 [8];
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined8 local_370;
  _Alloc_hider local_368;
  undefined1 local_360 [24];
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  uint16_t local_330;
  string *local_328;
  string *local_320;
  undefined1 local_318 [16];
  undefined4 local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  long local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined4 local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined4 local_2b8;
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  string local_1f0;
  string local_1d0;
  string local_1b0;
  type local_190 [2] [1];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  Error local_168;
  undefined4 local_140 [2];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined4 local_118 [2];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined4 local_f0 [2];
  long local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined4 local_c8 [2];
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  undefined4 local_a0 [2];
  long local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined4 local_78 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_328 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_320 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_3d8 = (undefined1  [8])((ulong)local_3d8 & 0xffffffff00000000);
    _Stack_3d0._M_p = "too few arguments";
    local_3c8._0_8_ = 0x11;
    local_3c8._8_8_ = 0;
    local_3b0._M_p = (pointer)0x0;
    pcVar9 = "too few arguments";
    local_3c8._16_8_ = (format_string_checker<char> *)local_3d8;
    do {
      pcVar6 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",(format_string_checker<char> *)local_3d8);
      }
      pcVar9 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_3d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_218 = 2;
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    local_390._0_4_ = local_218;
    local_388._M_p = local_380._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_210,local_210 + local_208);
    local_360._0_8_ = 0;
    local_360[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_390._0_4_;
    local_368._M_p = local_360 + 8;
    std::__cxx11::string::operator=(local_328,(string *)&local_388);
    std::__cxx11::string::operator=(local_320,(string *)&local_368);
    if (local_368._M_p != local_360 + 8) {
      operator_delete(local_368._M_p);
    }
    if (local_388._M_p != local_380._M_local_buf + 8) {
      operator_delete(local_388._M_p);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    paVar8 = &local_3f8.field_2;
    _Var10._M_p = local_3f8._M_dataplus._M_p;
    goto LAB_0024f749;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"get","");
  utils::ToLower((string *)local_390,pbVar2 + 1);
  utils::ToLower((string *)local_3d8,&local_3f8);
  if (local_388._M_p == _Stack_3d0._M_p) {
    if (local_388._M_p == (char *)0x0) {
      bVar13 = true;
    }
    else {
      iVar4 = bcmp((void *)local_390,(void *)local_3d8,(size_t)local_388._M_p);
      bVar13 = iVar4 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if (local_3d8 != (undefined1  [8])local_3c8) {
    operator_delete((void *)local_3d8);
  }
  if (local_390 != (undefined1  [8])&local_380) {
    operator_delete((void *)local_390);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (bVar13) {
LAB_0024e819:
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
    if (bVar13 && uVar5 == 0x40) {
      local_390 = (undefined1  [8])&local_380;
      local_388._M_p = (char *)0x0;
      local_380._M_local_buf[0] = '\0';
      local_368._M_p = (pointer)0x0;
      local_360._0_8_ = local_360._0_8_ & 0xffffffffffffff00;
      local_360._16_8_ = &local_340;
      local_348 = 0;
      local_340._M_local_buf[0] = '\0';
      local_330 = 0;
      peVar3 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_370 = local_360;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x3c])
                (local_78,peVar3,local_390,0xffff);
      local_3d8._0_4_ = local_78[0];
      _Stack_3d0._M_p = local_3c8 + 8;
      std::__cxx11::string::_M_construct<char*>((string *)&_Stack_3d0,local_70,local_70 + local_68);
      local_3a8 = 0;
      local_3a0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3d8._0_4_;
      local_3b0._M_p = (pointer)&local_3a0;
      std::__cxx11::string::operator=(local_328,(string *)&_Stack_3d0);
      this_00 = local_320;
      std::__cxx11::string::operator=(local_320,(string *)&local_3b0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      aDataset = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_p != &local_3a0) {
        operator_delete(local_3b0._M_p);
        aDataset = extraout_RDX_00;
      }
      if (_Stack_3d0._M_p != local_3c8 + 8) {
        operator_delete(_Stack_3d0._M_p);
        aDataset = extraout_RDX_01;
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
        aDataset = extraout_RDX_02;
      }
      if (EVar1 == kNone) {
        BbrDatasetToJson_abi_cxx11_(&local_50,(commissioner *)local_390,aDataset);
        Value::Value((Value *)local_3d8,&local_50);
        (__return_storage_ptr__->mError).mCode = local_3d8._0_4_;
        std::__cxx11::string::operator=(local_328,(string *)&_Stack_3d0);
        std::__cxx11::string::operator=(this_00,(string *)&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_p != &local_3a0) {
          operator_delete(local_3b0._M_p);
        }
        if (_Stack_3d0._M_p != local_3c8 + 8) {
          operator_delete(_Stack_3d0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._16_8_ != &local_340) {
        operator_delete((void *)local_360._16_8_);
      }
      if ((undefined1 *)local_370 != local_360) {
        operator_delete((void *)local_370);
      }
      paVar8 = &local_380;
      _Var10._M_p = (pointer)local_390;
      goto LAB_0024f749;
    }
    if (0x40 < uVar5) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"trihostname","");
      utils::ToLower((string *)local_390,pbVar2 + 2);
      utils::ToLower((string *)local_3d8,&local_3f8);
      if (local_388._M_p == _Stack_3d0._M_p) {
        if (local_388._M_p == (char *)0x0) {
          bVar14 = true;
        }
        else {
          iVar4 = bcmp((void *)local_390,(void *)local_3d8,(size_t)local_388._M_p);
          bVar14 = iVar4 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (local_3d8 != (undefined1  [8])local_3c8) {
        operator_delete((void *)local_3d8);
      }
      if (local_390 != (undefined1  [8])&local_380) {
        operator_delete((void *)local_390);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      if (bVar14) {
        local_3d8 = (undefined1  [8])local_3c8;
        _Stack_3d0._M_p = (char *)0x0;
        local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
        if (bVar13) {
          peVar3 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x37])
                    (local_c8,peVar3,local_3d8);
          local_390._0_4_ = local_c8[0];
          local_388._M_p = local_380._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,local_c0,local_c0 + local_b8);
          local_360._0_8_ = 0;
          local_360[8] = '\0';
          (__return_storage_ptr__->mError).mCode = local_390._0_4_;
          local_368._M_p = local_360 + 8;
          std::__cxx11::string::operator=(local_328,(string *)&local_388);
          std::__cxx11::string::operator=(local_320,(string *)&local_368);
          EVar1 = (__return_storage_ptr__->mError).mCode;
          if (local_368._M_p != local_360 + 8) {
            operator_delete(local_368._M_p);
          }
          if (local_388._M_p != local_380._M_local_buf + 8) {
            operator_delete(local_388._M_p);
          }
          if (local_c0 != local_b0) {
            operator_delete(local_c0);
          }
          if (EVar1 == kNone) {
            paVar8 = &local_1b0.field_2;
            local_1b0._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_3d8,_Stack_3d0._M_p + (long)local_3d8);
            Value::Value((Value *)local_390,&local_1b0);
            Value::operator=(__return_storage_ptr__,(Value *)local_390);
            Value::~Value((Value *)local_390);
            _Var10._M_p = local_1b0._M_dataplus._M_p;
            goto LAB_0024f65b;
          }
        }
        else {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_02.field_1.args_ = in_R9.args_;
            args_02.desc_ = (unsigned_long_long)local_318;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
            local_290 = 2;
            puVar12 = local_278;
            local_288 = puVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,local_3f8._M_dataplus._M_p,
                       local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
            local_390._0_4_ = local_290;
            local_388._M_p = local_380._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_388,local_288,local_288 + local_280);
            local_368._M_p = local_360 + 8;
            local_360._0_8_ = 0;
            local_360[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_390);
            Value::~Value((Value *)local_390);
            puVar11 = local_288;
            goto LAB_0024f722;
          }
          peVar3 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x38])
                    (local_a0,peVar3,pbVar2 + 3);
          local_390._0_4_ = local_a0[0];
          local_388._M_p = local_380._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,local_98,local_90 + local_98);
          local_368._M_p = local_360 + 8;
          local_360._0_8_ = 0;
          local_360[8] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_390);
          Value::~Value((Value *)local_390);
          paVar8 = &local_88;
LAB_0024f35e:
          _Var10._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   **)(paVar8->_M_local_buf + -0x10);
LAB_0024f735:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != paVar8) goto LAB_0024f73a;
        }
      }
      else {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"reghostname","");
        utils::ToLower((string *)local_390,pbVar2 + 2);
        utils::ToLower((string *)local_3d8,&local_3f8);
        if (local_388._M_p == _Stack_3d0._M_p) {
          if (local_388._M_p == (char *)0x0) {
            bVar14 = true;
          }
          else {
            iVar4 = bcmp((void *)local_390,(void *)local_3d8,(size_t)local_388._M_p);
            bVar14 = iVar4 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if (local_3d8 != (undefined1  [8])local_3c8) {
          operator_delete((void *)local_3d8);
        }
        if (local_390 != (undefined1  [8])&local_380) {
          operator_delete((void *)local_390);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        if (bVar14) {
          local_3d8 = (undefined1  [8])local_3c8;
          _Stack_3d0._M_p = (char *)0x0;
          local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
          if (!bVar13) {
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (0x60 < (ulong)((long)(aExpr->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
              peVar3 = (aCommissioner->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x3a])
                        (local_f0,peVar3,pbVar2 + 3);
              local_390._0_4_ = local_f0[0];
              local_388._M_p = local_380._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_388,local_e8,local_e0 + local_e8);
              local_368._M_p = local_360 + 8;
              local_360._0_8_ = 0;
              local_360[8] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_390);
              Value::~Value((Value *)local_390);
              paVar8 = &local_d8;
              goto LAB_0024f35e;
            }
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)local_318;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_03);
            local_2b8 = 2;
            puVar12 = local_2a0;
            local_2b0 = puVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b0,local_3f8._M_dataplus._M_p,
                       local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
            local_390._0_4_ = local_2b8;
            local_388._M_p = local_380._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_388,local_2b0,local_2b0 + local_2a8);
            local_368._M_p = local_360 + 8;
            local_360._0_8_ = 0;
            local_360[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_390);
            Value::~Value((Value *)local_390);
            puVar11 = local_2b0;
LAB_0024f722:
            if (puVar11 != puVar12) {
              operator_delete(puVar11);
            }
            paVar8 = &local_3f8.field_2;
            _Var10._M_p = local_3f8._M_dataplus._M_p;
            goto LAB_0024f735;
          }
          peVar3 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x39])
                    (local_118,peVar3,local_3d8);
          local_390._0_4_ = local_118[0];
          local_388._M_p = local_380._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,local_110,local_110 + local_108);
          local_368._M_p = local_360 + 8;
          local_360._0_8_ = 0;
          local_360[8] = '\0';
          pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_390);
          EVar1 = (pVVar7->mError).mCode;
          Value::~Value((Value *)local_390);
          if (local_110 != local_100) {
            operator_delete(local_110);
          }
          if (EVar1 != kNone) goto LAB_0024f73f;
          paVar8 = &local_1d0.field_2;
          local_1d0._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,local_3d8,_Stack_3d0._M_p + (long)local_3d8);
          Value::Value((Value *)local_390,&local_1d0);
          Value::operator=(__return_storage_ptr__,(Value *)local_390);
          Value::~Value((Value *)local_390);
          _Var10._M_p = local_1d0._M_dataplus._M_p;
        }
        else {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"regaddr","");
          utils::ToLower((string *)local_390,pbVar2 + 2);
          utils::ToLower((string *)local_3d8,&local_3f8);
          if (local_388._M_p == _Stack_3d0._M_p) {
            if (local_388._M_p == (char *)0x0) {
              bVar14 = true;
            }
            else {
              iVar4 = bcmp((void *)local_390,(void *)local_3d8,(size_t)local_388._M_p);
              bVar14 = iVar4 == 0;
            }
          }
          else {
            bVar14 = false;
          }
          if (local_3d8 != (undefined1  [8])local_3c8) {
            operator_delete((void *)local_3d8);
          }
          if (local_390 != (undefined1  [8])&local_380) {
            operator_delete((void *)local_390);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          if (bVar14) {
            local_3d8 = (undefined1  [8])local_3c8;
            _Stack_3d0._M_p = (char *)0x0;
            local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
            if (!bVar13) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_05.field_1.values_ = in_R9.values_;
              args_05.desc_ = (unsigned_long_long)local_318;
              ::fmt::v10::vformat_abi_cxx11_
                        (&local_3f8,(v10 *)"cannot set  read-only Registrar Address",
                         (string_view)ZEXT816(0x27),args_05);
              local_2e0 = 2;
              puVar12 = local_2c8;
              local_2d8 = puVar12;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d8,local_3f8._M_dataplus._M_p,
                         local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
              local_390._0_4_ = local_2e0;
              local_388._M_p = local_380._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_388,local_2d8,local_2d8 + local_2d0);
              local_368._M_p = local_360 + 8;
              local_360._0_8_ = 0;
              local_360[8] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_390);
              Value::~Value((Value *)local_390);
              puVar11 = local_2d8;
              goto LAB_0024f722;
            }
            peVar3 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x3b])
                      (local_140,peVar3,local_3d8);
            local_390._0_4_ = local_140[0];
            local_388._M_p = local_380._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_388,local_138,local_138 + local_130);
            local_368._M_p = local_360 + 8;
            local_360._0_8_ = 0;
            local_360[8] = '\0';
            pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_390);
            EVar1 = (pVVar7->mError).mCode;
            Value::~Value((Value *)local_390);
            if (local_138 != local_128) {
              operator_delete(local_138);
            }
            if (EVar1 != kNone) goto LAB_0024f73f;
            paVar8 = &local_1f0.field_2;
            local_1f0._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_3d8,_Stack_3d0._M_p + (long)local_3d8);
            Value::Value((Value *)local_390,&local_1f0);
            Value::operator=(__return_storage_ptr__,(Value *)local_390);
            Value::~Value((Value *)local_390);
            _Var10._M_p = local_1f0._M_dataplus._M_p;
          }
          else {
            if (!bVar13) {
              local_370 = local_360;
              local_390 = (undefined1  [8])&local_380;
              local_388._M_p = (pointer)0x0;
              local_380._M_local_buf[0] = '\0';
              local_368._M_p = (pointer)0x0;
              local_360._0_8_ = local_360._0_8_ & 0xffffffffffffff00;
              local_360._16_8_ = &local_340;
              local_348 = 0;
              local_340._M_local_buf[0] = '\0';
              local_330 = 0;
              BbrDatasetFromJson(&local_168,(BbrDataset *)local_390,
                                 (aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2);
              local_3d8._0_4_ = local_168.mCode;
              _Stack_3d0._M_p = local_3c8 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_3d0,local_168.mMessage._M_dataplus._M_p,
                         local_168.mMessage._M_dataplus._M_p + local_168.mMessage._M_string_length);
              local_3a8 = 0;
              local_3a0._M_local_buf[0] = '\0';
              local_3b0._M_p = (pointer)&local_3a0;
              pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_3d8);
              EVar1 = (pVVar7->mError).mCode;
              Value::~Value((Value *)local_3d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168.mMessage._M_dataplus._M_p != &local_168.mMessage.field_2) {
                operator_delete(local_168.mMessage._M_dataplus._M_p);
              }
              if (EVar1 == kNone) {
                peVar3 = (aCommissioner->
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x3d])
                          (local_190,peVar3,local_390);
                local_3d8._0_4_ = local_190[0][0];
                _Stack_3d0._M_p = local_3c8 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_3d0,local_188,local_188 + local_180);
                local_3a8 = 0;
                local_3a0._M_local_buf[0] = '\0';
                local_3b0._M_p = (pointer)&local_3a0;
                Value::operator=(__return_storage_ptr__,(Value *)local_3d8);
                Value::~Value((Value *)local_3d8);
                if (local_188 != local_178) {
                  operator_delete(local_188);
                }
              }
              BbrDataset::~BbrDataset((BbrDataset *)local_390);
              return __return_storage_ptr__;
            }
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_3f8._M_dataplus._M_p = pbVar2[2]._M_dataplus._M_p;
            local_3f8._M_string_length = pbVar2[2]._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x23;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&local_3f8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_3d8,(v10 *)"{} is not a valid BBR Dataset field",fmt_00,
                       args_04);
            local_308 = 2;
            paVar8 = &local_2f0;
            local_300 = paVar8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_3d8,_Stack_3d0._M_p + (long)local_3d8);
            local_390._0_4_ = local_308;
            local_388._M_p = local_380._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_388,local_300,local_300->_M_local_buf + local_2f8);
            local_368._M_p = local_360 + 8;
            local_360._0_8_ = 0;
            local_360[8] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_390);
            Value::~Value((Value *)local_390);
            _Var10._M_p = (pointer)local_300;
          }
        }
LAB_0024f65b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != paVar8) {
LAB_0024f73a:
          operator_delete(_Var10._M_p);
        }
      }
LAB_0024f73f:
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3c8;
      _Var10._M_p = (pointer)local_3d8;
      goto LAB_0024f749;
    }
    local_3d8 = (undefined1  [8])((ulong)local_3d8 & 0xffffffff00000000);
    _Stack_3d0._M_p = "too few arguments";
    local_3c8._0_8_ = 0x11;
    local_3c8._8_8_ = 0;
    local_3b0._M_p = (pointer)0x0;
    pcVar9 = "too few arguments";
    local_3c8._16_8_ = (format_string_checker<char> *)local_3d8;
    do {
      pcVar6 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",(format_string_checker<char> *)local_3d8);
      }
      pcVar9 = pcVar6;
    } while (pcVar6 != "");
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_3d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3f8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
    local_268 = 2;
    puVar12 = local_250;
    local_260 = puVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    local_390._0_4_ = local_268;
    local_388._M_p = local_380._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_260,local_260 + local_258);
    local_360._0_8_ = 0;
    local_360[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_390._0_4_;
    local_368._M_p = local_360 + 8;
    std::__cxx11::string::operator=(local_328,(string *)&local_388);
    std::__cxx11::string::operator=(local_320,(string *)&local_368);
    if (local_368._M_p != local_360 + 8) {
      operator_delete(local_368._M_p);
    }
    puVar11 = local_260;
    if (local_388._M_p != local_380._M_local_buf + 8) {
      operator_delete(local_388._M_p);
      puVar11 = local_260;
    }
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"set","");
    utils::ToLower((string *)local_390,pbVar2 + 1);
    utils::ToLower((string *)local_3d8,&local_3f8);
    if (local_388._M_p == _Stack_3d0._M_p) {
      if (local_388._M_p == (char *)0x0) {
        bVar14 = true;
      }
      else {
        iVar4 = bcmp((void *)local_390,(void *)local_3d8,(size_t)local_388._M_p);
        bVar14 = iVar4 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if (local_3d8 != (undefined1  [8])local_3c8) {
      operator_delete((void *)local_3d8);
    }
    if (local_390 != (undefined1  [8])&local_380) {
      operator_delete((void *)local_390);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p);
    }
    if (bVar14) goto LAB_0024e819;
    local_3d8._0_4_ = 0xd;
    _Stack_3d0._M_p = "\'{}\' is not a valid sub-command";
    local_3c8._0_8_ = 0x1f;
    local_3c8._8_8_ = 0x100000000;
    local_3b0._M_p =
         (pointer)::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar9 = "\'{}\' is not a valid sub-command";
    local_3c8._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_3d8;
    do {
      pcVar6 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar9,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_3d8);
      }
      pcVar9 = pcVar6;
    } while (pcVar6 != "");
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3d8 = (undefined1  [8])pbVar2[1]._M_dataplus._M_p;
    _Stack_3d0._M_p = (pointer)pbVar2[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_3d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3f8,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
    local_240 = 3;
    puVar12 = local_228;
    local_238 = puVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    local_390._0_4_ = local_240;
    local_388._M_p = local_380._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_238,local_238 + local_230);
    local_360._0_8_ = 0;
    local_360[8] = '\0';
    (__return_storage_ptr__->mError).mCode = local_390._0_4_;
    local_368._M_p = local_360 + 8;
    std::__cxx11::string::operator=(local_328,(string *)&local_388);
    std::__cxx11::string::operator=(local_320,(string *)&local_368);
    if (local_368._M_p != local_360 + 8) {
      operator_delete(local_368._M_p);
    }
    puVar11 = local_238;
    if (local_388._M_p != local_380._M_local_buf + 8) {
      operator_delete(local_388._M_p);
      puVar11 = local_238;
    }
  }
  if (puVar11 != puVar12) {
    operator_delete(puVar11);
  }
  paVar8 = &local_3f8.field_2;
  _Var10._M_p = local_3f8._M_dataplus._M_p;
LAB_0024f749:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar8) {
    operator_delete(_Var10._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBbrDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (aExpr.size() == 2 && !isSet)
    {
        BbrDataset dataset;
        SuccessOrExit(value = aCommissioner->GetBbrDataset(dataset, 0xFFFF));
        ExitNow(value = BbrDatasetToJson(dataset));
    }

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[2], "trihostname"))
    {
        std::string triHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetTriHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetTriHostname(triHostname));
            value = triHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "reghostname"))
    {
        std::string regHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetRegistrarHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetRegistrarHostname(regHostname));
            value = regHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "regaddr"))
    {
        std::string regAddr;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set  read-only Registrar Address"));
        SuccessOrExit(value = aCommissioner->GetRegistrarIpv6Addr(regAddr));
        value = regAddr;
    }
    else
    {
        if (isSet)
        {
            BbrDataset dataset;
            SuccessOrExit(value = BbrDatasetFromJson(dataset, aExpr[2]));
            SuccessOrExit(value = aCommissioner->SetBbrDataset(dataset));
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid BBR Dataset field", aExpr[2]);
        }
    }

exit:
    return value;
}